

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O0

optional<std::array<double,_2UL>_> * __thiscall
tinyusdz::primvar::PrimVar::get_value<std::array<double,2ul>>
          (optional<std::array<double,_2UL>_> *__return_storage_ptr__,PrimVar *this)

{
  bool bVar1;
  optional<std::array<double,_2UL>_> local_38;
  PrimVar *local_18;
  PrimVar *this_local;
  
  local_18 = this;
  this_local = (PrimVar *)__return_storage_ptr__;
  bVar1 = is_blocked(this);
  if (bVar1) {
    nonstd::optional_lite::optional<std::array<double,_2UL>_>::optional(__return_storage_ptr__);
  }
  else {
    bVar1 = has_default(this);
    if (bVar1) {
      tinyusdz::value::Value::get_value<std::array<double,2ul>>(&local_38,&this->_value,false);
      nonstd::optional_lite::optional<std::array<double,_2UL>_>::
      optional<std::array<double,_2UL>,_0>(__return_storage_ptr__,&local_38);
      nonstd::optional_lite::optional<std::array<double,_2UL>_>::~optional(&local_38);
    }
    else {
      nonstd::optional_lite::optional<std::array<double,_2UL>_>::optional(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {

    if (is_blocked()) {
      return nonstd::nullopt;
    }

    if (!has_default()) {
      return nonstd::nullopt;
    }

    return _value.get_value<T>();
  }